

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall
wasm::DataFlow::Graph::merge
          (Graph *this,
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *states,Locals *out)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  size_t sVar6;
  Type type;
  reference pFVar7;
  reference ppNVar8;
  Node *pNVar9;
  Node *value_00;
  Node *value;
  FlowState *state_3;
  iterator __end6;
  iterator __begin6;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range6;
  Node *phi;
  Node *condition;
  Index index;
  FlowState *state_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range3_1;
  Node *first;
  Node *node;
  FlowState *state_1;
  iterator __end3;
  iterator __begin3;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range3;
  bool bad;
  Index local_54;
  Node *pNStack_50;
  Index i;
  Node *block;
  Index numLocals;
  Index numStates;
  FlowState *state;
  iterator __end2;
  iterator __begin2;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range2;
  Locals *out_local;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *states_local;
  Graph *this_local;
  
  __end2 = std::
           vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           ::begin(states);
  state = (FlowState *)
          std::
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          ::end(states);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                                     *)&state), bVar1) {
    pFVar7 = __gnu_cxx::
             __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
             ::operator*(&__end2);
    bVar1 = isInUnreachable(this,&pFVar7->locals);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!isInUnreachable(state.locals)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x296,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
    __gnu_cxx::
    __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
    ::operator++(&__end2);
  }
  sVar4 = std::
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          ::size(states);
  uVar3 = (uint)sVar4;
  if (uVar3 == 0) {
    bVar1 = isInUnreachable(this);
    if (!bVar1) {
      __assert_fail("isInUnreachable()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x29c,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  else {
    setInReachable(this);
    if (uVar3 == 1) {
      pvVar5 = std::
               vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
               ::operator[](states,0);
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (out,&pvVar5->locals);
    }
    else {
      sVar6 = Function::getNumLocals(this->func);
      pNStack_50 = (Node *)0x0;
      for (local_54 = 0; local_54 < (uint)sVar6; local_54 = local_54 + 1) {
        type = Function::getLocalType(this->func,local_54);
        bVar1 = isRelevantType(this,type);
        if (bVar1) {
          bVar1 = false;
          __end3 = std::
                   vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   ::begin(states);
          state_1 = (FlowState *)
                    std::
                    vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                    ::end(states);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                                             *)&state_1), bVar2) {
            pFVar7 = __gnu_cxx::
                     __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                     ::operator*(&__end3);
            ppNVar8 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                      operator[](&pFVar7->locals,(ulong)local_54);
            pNVar9 = *ppNVar8;
            bVar2 = Node::isBad(pNVar9);
            if (bVar2) {
              bVar1 = true;
              ppNVar8 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ::operator[](out,(ulong)local_54);
              *ppNVar8 = pNVar9;
              break;
            }
            __gnu_cxx::
            __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
            ::operator++(&__end3);
          }
          if (!bVar1) {
            __range3_1 = (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                          *)0x0;
            __end3_1 = std::
                       vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                       ::begin(states);
            state_2 = (FlowState *)
                      std::
                      vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                      ::end(states);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3_1,
                                      (__normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                                       *)&state_2), bVar1) {
              pFVar7 = __gnu_cxx::
                       __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                       ::operator*(&__end3_1);
              if (__range3_1 !=
                  (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   *)0x0) {
                ppNVar8 = std::
                          vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                          operator[](&pFVar7->locals,(ulong)local_54);
                if (*ppNVar8 == (value_type)__range3_1) goto LAB_01bbe762;
                if (pNStack_50 == (Node *)0x0) {
                  pNVar9 = Node::makeBlock();
                  pNStack_50 = addNode(this,pNVar9);
                  for (condition._4_4_ = 0; condition._4_4_ < uVar3;
                      condition._4_4_ = condition._4_4_ + 1) {
                    pvVar5 = std::
                             vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                             ::operator[](states,(ulong)condition._4_4_);
                    phi = pvVar5->condition;
                    bVar1 = Node::isBad(phi);
                    if (!bVar1) {
                      pNVar9 = Node::makeCond(pNStack_50,condition._4_4_,phi);
                      phi = addNode(this,pNVar9);
                    }
                    Node::addValue(pNStack_50,phi);
                  }
                }
                pNVar9 = Node::makePhi(pNStack_50,local_54);
                pNVar9 = addNode(this,pNVar9);
                __end6 = std::
                         vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                         ::begin(states);
                state_3 = (FlowState *)
                          std::
                          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                          ::end(states);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end6,(
                                                  __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                                                  *)&state_3), bVar1) {
                  pFVar7 = __gnu_cxx::
                           __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                           ::operator*(&__end6);
                  ppNVar8 = std::
                            vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ::operator[](&pFVar7->locals,(ulong)local_54);
                  value_00 = expandFromI1(this,*ppNVar8,(Expression *)0x0);
                  Node::addValue(pNVar9,value_00);
                  __gnu_cxx::
                  __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
                  ::operator++(&__end6);
                }
                ppNVar8 = std::
                          vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                          operator[](out,(ulong)local_54);
                *ppNVar8 = pNVar9;
                break;
              }
              ppNVar8 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ::operator[](&pFVar7->locals,(ulong)local_54);
              __range3_1 = (vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                            *)*ppNVar8;
              ppNVar8 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ::operator[](out,(ulong)local_54);
              *ppNVar8 = (value_type)__range3_1;
LAB_01bbe762:
              __gnu_cxx::
              __normal_iterator<wasm::DataFlow::Graph::FlowState_*,_std::vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>_>
              ::operator++(&__end3_1);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void merge(std::vector<FlowState>& states, Locals& out) {
    // We should only receive reachable states.
#ifndef NDEBUG
    for (auto& state : states) {
      assert(!isInUnreachable(state.locals));
    }
#endif
    Index numStates = states.size();
    if (numStates == 0) {
      // We were unreachable, and still are.
      assert(isInUnreachable());
      return;
    }
    // We may have just become reachable, if we were not before.
    setInReachable();
    // Just one thing to merge is trivial.
    if (numStates == 1) {
      out = states[0].locals;
      return;
    }
    // We create a block if we need one.
    Index numLocals = func->getNumLocals();
    Node* block = nullptr;
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      // Process the inputs. If any is bad, the phi is bad.
      bool bad = false;
      for (auto& state : states) {
        auto* node = state.locals[i];
        if (node->isBad()) {
          bad = true;
          out[i] = node;
          break;
        }
      }
      if (bad) {
        continue;
      }
      // Nothing is bad, proceed.
      Node* first = nullptr;
      for (auto& state : states) {
        if (!first) {
          first = out[i] = state.locals[i];
        } else if (state.locals[i] != first) {
          // We need to actually merge some stuff.
          if (!block) {
            block = addNode(Node::makeBlock());
            for (Index index = 0; index < numStates; index++) {
              auto* condition = states[index].condition;
              if (!condition->isBad()) {
                condition = addNode(Node::makeCond(block, index, condition));
              }
              block->addValue(condition);
            }
          }
          auto* phi = addNode(Node::makePhi(block, i));
          for (auto& state : states) {
            auto* value = expandFromI1(state.locals[i], nullptr);
            phi->addValue(value);
          }
          out[i] = phi;
          break;
        }
      }
    }
  }